

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

mat<double,_3,_3> * linalg::qmat<double>(vec<double,_4> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  mat<double,_3,_3> *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar1 = q->w;
  dVar2 = q->x;
  dVar3 = q->y;
  dVar4 = q->z;
  dVar9 = dVar2 * dVar3 + dVar1 * dVar4;
  dVar11 = dVar4 * dVar2 - dVar1 * dVar3;
  dVar7 = dVar2 * dVar3 - dVar1 * dVar4;
  dVar6 = dVar1 * dVar1 - dVar2 * dVar2;
  dVar10 = dVar3 * dVar4 + dVar1 * dVar2;
  dVar8 = dVar1 * dVar3 + dVar4 * dVar2;
  dVar5 = dVar3 * dVar4 - dVar1 * dVar2;
  (in_RDI->x).x = dVar1 * dVar1 + dVar2 * dVar2 + -dVar3 * dVar3 + -dVar4 * dVar4;
  (in_RDI->x).y = dVar9 + dVar9;
  (in_RDI->x).z = dVar11 + dVar11;
  (in_RDI->y).x = dVar7 + dVar7;
  (in_RDI->y).y = dVar3 * dVar3 + dVar6 + -dVar4 * dVar4;
  (in_RDI->y).z = dVar10 + dVar10;
  (in_RDI->z).x = dVar8 + dVar8;
  (in_RDI->z).y = dVar5 + dVar5;
  (in_RDI->z).z = dVar4 * dVar4 + dVar6 + -dVar3 * dVar3;
  return in_RDI;
}

Assistant:

constexpr vec<T,3>   qzdir (const vec<T,4> & q)                          { return {(q.z*q.x+q.y*q.w)*2, (q.y*q.z-q.x*q.w)*2, q.w*q.w-q.x*q.x-q.y*q.y+q.z*q.z}; }